

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiComponentRDF.cpp
# Opt level: O0

void __thiscall
OpenMD::MultiComponentRDF::processNonOverlapping
          (MultiComponentRDF *this,SelectionManager *sman1,SelectionManager *sman2,int pairIndex)

{
  undefined4 in_ECX;
  long *in_RDI;
  int j;
  int i;
  StuntDouble *sd2;
  StuntDouble *sd1;
  int *in_stack_ffffffffffffffc8;
  SelectionManager *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  
  local_28 = SelectionManager::beginSelected(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  while (local_28 != (StuntDouble *)0x0) {
    for (in_stack_ffffffffffffffd0 =
              (SelectionManager *)
              SelectionManager::beginSelected(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffffd0 != (SelectionManager *)0x0;
        in_stack_ffffffffffffffd0 =
             (SelectionManager *)
             SelectionManager::nextSelected(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)) {
      (**(code **)(*in_RDI + 0x48))(in_RDI,local_28,in_stack_ffffffffffffffd0,in_ECX);
    }
    local_28 = SelectionManager::nextSelected((SelectionManager *)0x0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void MultiComponentRDF::processNonOverlapping(SelectionManager& sman1,
                                                SelectionManager& sman2,
                                                int pairIndex) {
    StuntDouble* sd1;
    StuntDouble* sd2;
    int i;
    int j;

    // This is the same as a non-overlapping pairwise loop structure:
    // for (int i = 0;  i < ni ; ++i ) {
    //   for (int j = 0; j < nj; ++j) {}
    // }

    for (sd1 = sman1.beginSelected(i); sd1 != NULL;
         sd1 = sman1.nextSelected(i)) {
      for (sd2 = sman2.beginSelected(j); sd2 != NULL;
           sd2 = sman2.nextSelected(j)) {
        collectHistograms(sd1, sd2, pairIndex);
      }
    }
  }